

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void SubRefTimestep(SstStream Stream,ssize_t Timestep,int SetLast)

{
  long in_RSI;
  SstStream in_RDI;
  CPTimestepList List;
  CPTimestepList local_20;
  
  for (local_20 = in_RDI->QueuedTimesteps; local_20 != (CPTimestepList)0x0;
      local_20 = local_20->Next) {
    if (local_20->Timestep == in_RSI) {
      local_20->ReferenceCount = local_20->ReferenceCount + -1;
      CP_verbose(in_RDI,TraceVerbose,
                 "SubRef : Writer-side Timestep %ld now has reference count %d, expired %d, precious %d\n"
                 ,local_20->Timestep,(ulong)(uint)local_20->ReferenceCount,
                 (ulong)(uint)local_20->Expired,local_20->PreciousTimestep);
    }
  }
  return;
}

Assistant:

static void SubRefTimestep(SstStream Stream, ssize_t Timestep, int SetLast)
{
    CPTimestepList List;
    List = Stream->QueuedTimesteps;
    STREAM_ASSERT_LOCKED(Stream);
    while (List)
    {
        if (List->Timestep == Timestep)
        {
            List->ReferenceCount--;
            CP_verbose(Stream, TraceVerbose,
                       "SubRef : Writer-side Timestep %ld "
                       "now has reference count %d, expired %d, precious %d\n",
                       List->Timestep, List->ReferenceCount, List->Expired, List->PreciousTimestep);
        }
        List = List->Next;
    }
}